

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor_unittest.cc
# Opt level: O1

void __thiscall
google::protobuf::descriptor_unittest::FileDescriptorTest_BuildAgain_Test::TestBody
          (FileDescriptorTest_BuildAgain_Test *this)

{
  DescriptorPool *this_00;
  FileDescriptor *pFVar1;
  pointer *__ptr_2;
  pointer *__ptr;
  char *message;
  char *in_R9;
  string_view value;
  AssertionResult gtest_ar_;
  AssertionResult gtest_ar;
  FileDescriptorProto file;
  AssertHelper local_148;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_140;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_138;
  AssertHelper local_130;
  undefined1 local_128 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_120;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_118;
  undefined1 local_108 [248];
  
  FileDescriptorProto::FileDescriptorProto((FileDescriptorProto *)local_108,(Arena *)0x0);
  FileDescriptor::CopyTo
            ((this->super_FileDescriptorTest).foo_file_,(FileDescriptorProto *)local_108);
  this_00 = &(this->super_FileDescriptorTest).pool_;
  local_140._M_head_impl =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
       DescriptorPool::BuildFile(this_00,(FileDescriptorProto *)local_108);
  testing::internal::
  CmpHelperEQ<google::protobuf::FileDescriptor_const*,google::protobuf::FileDescriptor_const*>
            ((internal *)local_128,"foo_file_","pool_.BuildFile(file)",
             &(this->super_FileDescriptorTest).foo_file_,(FileDescriptor **)&local_140);
  if (local_128[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_140);
    if (local_120 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      message = anon_var_dwarf_a12c75 + 5;
    }
    else {
      message = (local_120->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_148,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor_unittest.cc"
               ,0x1cc,message);
    testing::internal::AssertHelper::operator=(&local_148,(Message *)&local_140);
    testing::internal::AssertHelper::~AssertHelper(&local_148);
    if ((FileDescriptor *)local_140._M_head_impl != (FileDescriptor *)0x0) {
      (**(code **)(*(long *)local_140._M_head_impl + 8))();
    }
  }
  if (local_120 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_120,local_120);
  }
  local_108[0x10] = local_108[0x10] | 2;
  if ((local_108._8_8_ & 1) != 0) {
    local_108._8_8_ = *(undefined8 *)(local_108._8_8_ & 0xfffffffffffffffe);
  }
  value._M_str = "some.other.package";
  value._M_len = 0x12;
  protobuf::internal::ArenaStringPtr::Set
            ((ArenaStringPtr *)(local_108 + 0xd0),value,(Arena *)local_108._8_8_);
  pFVar1 = DescriptorPool::BuildFile(this_00,(FileDescriptorProto *)local_108);
  local_140._M_head_impl._0_1_ = pFVar1 == (FileDescriptor *)0x0;
  local_138 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (pFVar1 != (FileDescriptor *)0x0) {
    testing::Message::Message((Message *)&local_148);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_128,(internal *)&local_140,
               (AssertionResult *)"pool_.BuildFile(file) == nullptr","false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_130,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor_unittest.cc"
               ,0x1d0,(char *)CONCAT71(local_128._1_7_,local_128[0]));
    testing::internal::AssertHelper::operator=(&local_130,(Message *)&local_148);
    testing::internal::AssertHelper::~AssertHelper(&local_130);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT71(local_128._1_7_,local_128[0]) != &local_118) {
      operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)CONCAT71(local_128._1_7_,local_128[0]),local_118._M_allocated_capacity + 1)
      ;
    }
    if (local_148.data_ != (AssertHelperData *)0x0) {
      (**(code **)(*(long *)local_148.data_ + 8))();
    }
  }
  if (local_138 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_138,local_138);
  }
  FileDescriptorProto::~FileDescriptorProto((FileDescriptorProto *)local_108);
  return;
}

Assistant:

TEST_F(FileDescriptorTest, BuildAgain) {
  // Test that if we call BuildFile again on the same input we get the same
  // FileDescriptor back.
  FileDescriptorProto file;
  foo_file_->CopyTo(&file);
  EXPECT_EQ(foo_file_, pool_.BuildFile(file));

  // But if we change the file then it won't work.
  file.set_package("some.other.package");
  EXPECT_TRUE(pool_.BuildFile(file) == nullptr);
}